

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.cpp
# Opt level: O1

void __thiscall pbrt::FormattingScene::~FormattingScene(FormattingScene *this)

{
  ~FormattingScene(this);
  operator_delete(this,0xd8);
  return;
}

Assistant:

FormattingScene::~FormattingScene() {
    if (errorExit)
        ErrorExit("Fatal errors during scene updating.");
}